

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsubcmesh.cpp
# Opt level: O0

void __thiscall TPZSubCompMesh::Read(TPZSubCompMesh *this)

{
  void *in_stack_000000d0;
  TPZStream *in_stack_000000d8;
  TPZSubCompMesh *in_stack_000000e0;
  
  Read(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
  return;
}

Assistant:

void TPZSubCompMesh::Read(TPZStream &buf, void *context)
{
	TPZCompEl::Read(buf,context);
	TPZCompMesh::Read(buf,Mesh()->Reference());
    TPZCompMesh *mesh = (TPZCompMesh *) context;
    TPZManVector<int> matindex;
    buf.Read( matindex);
    int sz = matindex.size();
    for (int im=0; im<sz; im++) {
        MaterialVec()[matindex[im]] = mesh->MaterialVec()[matindex[im]];
    }
	buf.Read(fConnectIndex);
	buf.Read(fExternalLocIndex);
	buf.Read( fFatherToLocal);
    buf.Read(&fSingularConnect,1);
}